

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O1

void __thiscall QEvdevTouchScreenData::assignIds(QEvdevTouchScreenData *this)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *pDVar4;
  int iVar5;
  QEvdevTouchScreenData *pQVar6;
  ulong uVar7;
  Contact *args;
  int iVar8;
  QHash<int,_QEvdevTouchScreenData::Contact> QVar9;
  int iVar10;
  QHash<int,_QEvdevTouchScreenData::Contact> QVar11;
  uint uVar12;
  Data *pDVar13;
  Data *pDVar14;
  long in_FS_OFFSET;
  bool bVar15;
  const_iterator it;
  int bestId;
  QHash<int,_QEvdevTouchScreenData::Contact> pending;
  QHash<int,_QEvdevTouchScreenData::Contact> candidates;
  int dist;
  QEvdevTouchScreenData *local_68;
  int local_5c;
  QHash<int,_QEvdevTouchScreenData::Contact> local_58;
  QHash<int,_QEvdevTouchScreenData::Contact> local_50;
  QHash<int,_QEvdevTouchScreenData::Contact> local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (this->m_lastContacts).d;
  if ((local_48.d != (Data *)0x0) &&
     (((local_48.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_48.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_50.d = (this->m_contacts).d;
  if (((QEvdevTouchScreenData *)local_50.d != (QEvdevTouchScreenData *)0x0) &&
     ((((RefCount *)&((QEvdevTouchScreenData *)local_50.d)->q)->atomic)._q_value.
      super___atomic_base<int>._M_i != -1)) {
    LOCK();
    (((RefCount *)&((QEvdevTouchScreenData *)local_50.d)->q)->atomic)._q_value.
    super___atomic_base<int>._M_i =
         (((RefCount *)&((QEvdevTouchScreenData *)local_50.d)->q)->atomic)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.d = (Data *)0x0;
  bVar15 = (QEvdevTouchScreenData *)local_50.d == (QEvdevTouchScreenData *)0x0;
  iVar10 = -1;
  if (!bVar15) {
    pDVar13 = (Data *)0x0;
    local_68 = (QEvdevTouchScreenData *)0x0;
    do {
      if ((((local_50.d)->size == 0) || (local_48.d == (Data *)0x0)) || ((local_48.d)->size == 0))
      break;
      local_5c = 0;
      QVar9.d = local_50.d;
      if (bVar15) {
LAB_0012b8a0:
        QVar11.d = (Data *)(QEvdevTouchScreenData *)0x0;
LAB_0012b8c7:
        pDVar14 = (Data *)0x0;
      }
      else {
        if (1 < (uint)((local_50.d)->ref).atomic._q_value.super___atomic_base<int>._M_i) {
          pQVar6 = (QEvdevTouchScreenData *)
                   QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::
                   detached(local_50.d);
          QVar9.d = local_50.d;
          local_50.d = (Data *)pQVar6;
        }
        QVar11.d = local_50.d;
        if ((local_50.d)->spans->offsets[0] != 0xff) goto LAB_0012b8c7;
        pDVar4 = (Data *)0x1;
        do {
          pDVar14 = pDVar4;
          if ((((QList<QWindowSystemInterface::TouchPoint> *)&(local_50.d)->numBuckets)->d).d ==
              pDVar14) goto LAB_0012b8a0;
          pDVar4 = (Data *)((long)&(pDVar14->super_QArrayData).ref_._q_value.
                                   super___atomic_base<int>._M_i + 1);
        } while ((local_50.d)->spans[(ulong)pDVar14 >> 7].offsets[(uint)pDVar14 & 0x7f] == 0xff);
      }
      if (pDVar14 == (Data *)0x0 &&
          (QEvdevTouchScreenData *)QVar11.d == (QEvdevTouchScreenData *)0x0) {
        bVar15 = false;
      }
      else {
        iVar8 = -1;
        do {
          local_3c = -0x55555556;
          pSVar2 = (Span *)(((QEvdevTouchScreenData *)QVar11.d)->m_touchPoints).d.size;
          pEVar3 = pSVar2[(ulong)pDVar14 >> 7].entries;
          bVar1 = pSVar2[(ulong)pDVar14 >> 7].offsets[(uint)pDVar14 & 0x7f];
          iVar5 = findClosestContact((QEvdevTouchScreenData *)QVar9.d,&local_48,
                                     *(int *)(pEVar3[bVar1].storage.data + 8),
                                     *(int *)(pEVar3[bVar1].storage.data + 0xc),&local_3c);
          if ((-1 < iVar5) && (local_3c < iVar8 || iVar8 == -1)) {
            pDVar13 = pDVar14;
            local_68 = (QEvdevTouchScreenData *)QVar11.d;
            local_5c = iVar5;
            iVar8 = local_3c;
          }
          do {
            if ((Data *)((long)&(((QEvdevTouchScreenData *)QVar11.d)->m_touchPoints).d.d[-1].
                                super_QArrayData.alloc + 7) == pDVar14) {
              pDVar14 = (Data *)0x0;
              QVar11.d = (Data *)0x0;
              break;
            }
            pDVar14 = (Data *)((long)&(pDVar14->super_QArrayData).ref_._q_value.
                                      super___atomic_base<int>._M_i + 1);
          } while (((Span *)(((QEvdevTouchScreenData *)QVar11.d)->m_touchPoints).d.size)
                   [(ulong)pDVar14 >> 7].offsets[(uint)pDVar14 & 0x7f] == 0xff);
        } while ((pDVar14 != (Data *)0x0) ||
                ((QEvdevTouchScreenData *)QVar11.d != (QEvdevTouchScreenData *)0x0));
        bVar15 = -1 < iVar8;
      }
      if (bVar15) {
        pSVar2 = (Span *)(local_68->m_touchPoints).d.size;
        uVar7 = (ulong)pDVar13 >> 7;
        uVar12 = (uint)pDVar13 & 0x7f;
        pEVar3 = pSVar2[uVar7].entries;
        *(int *)(pEVar3[pSVar2[uVar7].offsets[uVar12]].storage.data + 4) = local_5c;
        local_3c = local_5c;
        QHash<int,QEvdevTouchScreenData::Contact>::emplace<QEvdevTouchScreenData::Contact_const&>
                  ((QHash<int,QEvdevTouchScreenData::Contact> *)&local_58,&local_3c,
                   (Contact *)(pEVar3[pSVar2[uVar7].offsets[uVar12]].storage.data + 4));
        QHash<int,_QEvdevTouchScreenData::Contact>::removeImpl<int>(&local_48,&local_5c);
        it.i.bucket = (size_t)pDVar13;
        it.i.d = (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)local_68;
        QHash<int,_QEvdevTouchScreenData::Contact>::erase(&local_50,it);
        if (iVar10 < local_5c) {
          iVar10 = local_5c;
        }
      }
      bVar15 = (QEvdevTouchScreenData *)local_50.d == (QEvdevTouchScreenData *)0x0;
    } while (!bVar15);
  }
  if ((local_48.d == (Data *)0x0) || ((local_48.d)->size == 0)) {
    QVar9.d = (Data *)(QEvdevTouchScreenData *)0x0;
    pDVar13 = (Data *)0x0;
    if (!bVar15) {
      if (1 < (uint)((local_50.d)->ref).atomic._q_value.super___atomic_base<int>._M_i) {
        local_50.d = QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::
                     detached(local_50.d);
      }
      QVar9.d = local_50.d;
      if ((local_50.d)->spans->offsets[0] == 0xff) {
        pDVar4 = (Data *)0x1;
        do {
          pDVar13 = pDVar4;
          if ((((QList<QWindowSystemInterface::TouchPoint> *)&(local_50.d)->numBuckets)->d).d ==
              pDVar13) {
            QVar9.d = (Data *)(QEvdevTouchScreenData *)0x0;
            pDVar13 = (Data *)0x0;
            break;
          }
          pDVar4 = (Data *)((long)&(pDVar13->super_QArrayData).ref_._q_value.
                                   super___atomic_base<int>._M_i + 1);
        } while ((local_50.d)->spans[(ulong)pDVar13 >> 7].offsets[(uint)pDVar13 & 0x7f] == 0xff);
      }
      else {
        pDVar13 = (Data *)0x0;
      }
    }
    if (pDVar13 != (Data *)0x0 || (QEvdevTouchScreenData *)QVar9.d != (QEvdevTouchScreenData *)0x0)
    {
      do {
        iVar10 = iVar10 + 1;
        pSVar2 = (Span *)(((QEvdevTouchScreenData *)QVar9.d)->m_touchPoints).d.size;
        uVar7 = (ulong)pDVar13 >> 7;
        uVar12 = (uint)pDVar13 & 0x7f;
        pEVar3 = pSVar2[uVar7].entries;
        *(int *)(pEVar3[pSVar2[uVar7].offsets[uVar12]].storage.data + 4) = iVar10;
        args = (Contact *)(pEVar3[pSVar2[uVar7].offsets[uVar12]].storage.data + 4);
        local_3c = args->trackingId;
        QHash<int,QEvdevTouchScreenData::Contact>::emplace<QEvdevTouchScreenData::Contact_const&>
                  ((QHash<int,QEvdevTouchScreenData::Contact> *)&local_58,&local_3c,args);
        do {
          if ((Data *)((long)&(((QEvdevTouchScreenData *)QVar9.d)->m_touchPoints).d.d[-1].
                              super_QArrayData.alloc + 7) == pDVar13) {
            pDVar13 = (Data *)0x0;
            QVar9.d = (Data *)0x0;
            break;
          }
          pDVar13 = (Data *)((long)&(pDVar13->super_QArrayData).ref_._q_value.
                                    super___atomic_base<int>._M_i + 1);
        } while (((Span *)(((QEvdevTouchScreenData *)QVar9.d)->m_touchPoints).d.size)
                 [(ulong)pDVar13 >> 7].offsets[(uint)pDVar13 & 0x7f] == 0xff);
      } while ((pDVar13 != (Data *)0x0) ||
              ((QEvdevTouchScreenData *)QVar9.d != (QEvdevTouchScreenData *)0x0));
    }
  }
  QHash<int,_QEvdevTouchScreenData::Contact>::operator=(&this->m_contacts,&local_58);
  QHash<int,_QEvdevTouchScreenData::Contact>::~QHash(&local_58);
  QHash<int,_QEvdevTouchScreenData::Contact>::~QHash(&local_50);
  QHash<int,_QEvdevTouchScreenData::Contact>::~QHash(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEvdevTouchScreenData::assignIds()
{
    QHash<int, Contact> candidates = m_lastContacts, pending = m_contacts, newContacts;
    int maxId = -1;
    QHash<int, Contact>::iterator it, ite, bestMatch;
    while (!pending.isEmpty() && !candidates.isEmpty()) {
        int bestDist = -1, bestId = 0;
        for (it = pending.begin(), ite = pending.end(); it != ite; ++it) {
            int dist;
            int id = findClosestContact(candidates, it->x, it->y, &dist);
            if (id >= 0 && (bestDist == -1 || dist < bestDist)) {
                bestDist = dist;
                bestId = id;
                bestMatch = it;
            }
        }
        if (bestDist >= 0) {
            bestMatch->trackingId = bestId;
            newContacts.insert(bestId, *bestMatch);
            candidates.remove(bestId);
            pending.erase(bestMatch);
            if (bestId > maxId)
                maxId = bestId;
        }
    }
    if (candidates.isEmpty()) {
        for (it = pending.begin(), ite = pending.end(); it != ite; ++it) {
            it->trackingId = ++maxId;
            newContacts.insert(it->trackingId, *it);
        }
    }
    m_contacts = newContacts;
}